

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_models_md3.cpp
# Opt level: O3

void __thiscall
FMD3Model::RenderFrame
          (FMD3Model *this,FTexture *skin,int frameno,int frameno2,double inter,int translation)

{
  int iVar1;
  MD3Surface *pMVar2;
  uint uVar3;
  FMaterial *this_00;
  long lVar4;
  long lVar5;
  FTexture *tex;
  
  if (frameno2 < this->numFrames && frameno < this->numFrames) {
    gl_RenderState.mInterpolationFactor = (float)inter;
    if (0 < this->numSurfaces) {
      lVar4 = 0;
      lVar5 = 0;
      do {
        pMVar2 = this->surfaces;
        tex = skin;
        if (skin == (FTexture *)0x0) {
          uVar3 = ((this->super_FModel).curSpriteMDLFrame)->surfaceskinIDs
                  [(this->super_FModel).curMDLIndex][lVar5].texnum;
          if ((int)uVar3 < 1) {
            if (*(int *)((long)&pMVar2->numSkins + lVar4) < 1) {
              return;
            }
            uVar3 = **(uint **)((long)&pMVar2->skins + lVar4);
            if ((int)uVar3 < 1) {
              return;
            }
          }
          if (TexMan.Textures.Count <= uVar3) {
            return;
          }
          tex = TexMan.Textures.Array[TexMan.Translation.Array[uVar3]].Texture;
          if (tex == (FTexture *)0x0) {
            return;
          }
        }
        this_00 = FMaterial::ValidateTexture(tex,false);
        gl_RenderState.mEffectState = this_00->mShaderIndex;
        gl_RenderState.mShaderTimer = (this_00->tex->gl_info).shaderspeed;
        FMaterial::Bind(this_00,0,translation);
        FRenderState::Apply(&gl_RenderState);
        uVar3 = *(uint *)((long)&pMVar2->numVertices + lVar4);
        iVar1 = *(int *)((long)&pMVar2->vindex + lVar4);
        FModelVertexBuffer::SetupFrame
                  ((this->super_FModel).mVBuf,uVar3 * frameno + iVar1,uVar3 * frameno2 + iVar1,uVar3
                  );
        (*_ptrc_glDrawElements)
                  (4,*(int *)((long)&pMVar2->numTriangles + lVar4) * 3,0x1405,
                   (void *)((ulong)*(uint *)((long)&pMVar2->iindex + lVar4) << 2));
        lVar5 = lVar5 + 1;
        lVar4 = lVar4 + 0x38;
      } while (lVar5 < this->numSurfaces);
    }
    gl_RenderState.mInterpolationFactor = 0.0;
  }
  return;
}

Assistant:

void FMD3Model::RenderFrame(FTexture * skin, int frameno, int frameno2, double inter, int translation)
{
	if (frameno>=numFrames || frameno2>=numFrames) return;

	gl_RenderState.SetInterpolationFactor((float)inter);
	for(int i=0;i<numSurfaces;i++)
	{
		MD3Surface * surf = &surfaces[i];

		// [BB] In case no skin is specified via MODELDEF, check if the MD3 has a skin for the current surface.
		// Note: Each surface may have a different skin.
		FTexture *surfaceSkin = skin;
		if (!surfaceSkin)
		{
			if (curSpriteMDLFrame->surfaceskinIDs[curMDLIndex][i].isValid())
			{
				surfaceSkin = TexMan(curSpriteMDLFrame->surfaceskinIDs[curMDLIndex][i]);
			}
			else if(surf->numSkins > 0 && surf->skins[0].isValid())
			{
				surfaceSkin = TexMan(surf->skins[0]);
			}

			if (!surfaceSkin) return;
		}

		FMaterial * tex = FMaterial::ValidateTexture(surfaceSkin, false);

		gl_RenderState.SetMaterial(tex, CLAMP_NONE, translation, -1, false);

		gl_RenderState.Apply();
		mVBuf->SetupFrame(surf->vindex + frameno * surf->numVertices, surf->vindex + frameno2 * surf->numVertices, surf->numVertices);
		glDrawElements(GL_TRIANGLES, surf->numTriangles * 3, GL_UNSIGNED_INT, (void*)(intptr_t)(surf->iindex * sizeof(unsigned int)));
	}
	gl_RenderState.SetInterpolationFactor(0.f);
}